

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall Catch::RunContext::~RunContext(RunContext *this)

{
  IEventListener *pIVar1;
  ITracker *pIVar2;
  pointer ppIVar3;
  
  pIVar1 = (this->m_reporter).m_ptr;
  (*this->m_config->_vptr_IConfig[9])();
  (*pIVar1->_vptr_IEventListener[0x11])(pIVar1);
  if (altStackMem != (void *)0x0) {
    operator_delete__(altStackMem);
  }
  altStackMem = (void *)0x0;
  pIVar2 = (this->m_trackerContext).m_rootTracker.m_ptr;
  if (pIVar2 != (ITracker *)0x0) {
    (*pIVar2->_vptr_ITracker[1])();
  }
  ppIVar3 = (this->m_activeSections).
            super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppIVar3 != (pointer)0x0) {
    operator_delete(ppIVar3,(long)(this->m_activeSections).
                                  super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppIVar3
                   );
  }
  std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::~vector
            (&this->m_unfinishedSections);
  std::vector<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>::~vector
            (&this->m_messageScopes);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector(&this->m_messages);
  pIVar1 = (this->m_reporter).m_ptr;
  if (pIVar1 != (IEventListener *)0x0) {
    (*pIVar1->_vptr_IEventListener[1])();
  }
  Optional<Catch::AssertionResult>::reset(&this->m_lastResult);
  return;
}

Assistant:

RunContext::~RunContext() {
        m_reporter->testRunEnded(TestRunStats(m_runInfo, m_totals, aborting()));
    }